

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_joystick.cpp
# Opt level: O1

void __thiscall SDLInputJoystickManager::~SDLInputJoystickManager(SDLInputJoystickManager *this)

{
  SDLInputJoystick *pSVar1;
  ulong uVar2;
  
  if ((this->Joysticks).Count != 0) {
    uVar2 = 0;
    do {
      pSVar1 = (this->Joysticks).Array[uVar2];
      if (pSVar1 != (SDLInputJoystick *)0x0) {
        (*(pSVar1->super_IJoystickConfig)._vptr_IJoystickConfig[1])();
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (this->Joysticks).Count);
  }
  TArray<SDLInputJoystick_*,_SDLInputJoystick_*>::~TArray(&this->Joysticks);
  return;
}

Assistant:

~SDLInputJoystickManager()
	{
		for(unsigned int i = 0;i < Joysticks.Size();i++)
			delete Joysticks[i];
	}